

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

int __thiscall NavierStokesBase::nghost_state(NavierStokesBase *this)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = amrex::EBFArrayBoxFactory::isAllRegular
                    ((EBFArrayBoxFactory *)
                     (this->super_AmrLevel).m_factory._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                     _M_head_impl);
  if (bVar1) {
    bVar1 = std::operator==(&advection_scheme_abi_cxx11_,"MOL");
    uVar2 = bVar1 ^ 3;
  }
  else {
    uVar2 = 4;
  }
  return uVar2;
}

Assistant:

int
NavierStokesBase::nghost_state ()
{
#ifdef AMREX_USE_EB
  if (!EBFactory().isAllRegular())
  {
        return 4;
  }
  else
#endif
  {
    return (advection_scheme == "MOL" ) ? 2 : 3;
}
}